

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *this,int64_t id,TPZVec<long> *nodeindexes,
          int matind,TPZGeoMesh *mesh)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoMesh *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  TPZQuadraticTetra *in_stack_ffffffffffffff60;
  void **in_stack_ffffffffffffff68;
  TPZGeoEl *in_stack_ffffffffffffff70;
  int64_t *local_80;
  TPZGeoElSideIndex local_60;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  
  local_30 = 0;
  local_38 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02471338);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (int64_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                     in_stack_ffffffffffffff50);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02471020;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02471020;
  pzgeom::TPZQuadraticTetra::TPZQuadraticTetra
            (in_stack_ffffffffffffff60,
             (TPZVec<long> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_80 = (int64_t *)&in_RDI[2].fMatId;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff50);
    local_80 = local_80 + 3;
  } while ((TPZGeoEl *)local_80 != in_RDI + 8);
  for (local_48 = 0; local_48 < 0xf; local_48 = local_48 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[2].fMatId + (long)local_48 * 6),&local_60);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1bc75c8);
  }
  pzgeom::TPZNodeRep<10,_pztopology::TPZTetrahedron>::Initialize
            ((TPZNodeRep<10,_pztopology::TPZTetrahedron> *)(in_RDI + 1),in_RDI);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(id,matind,mesh) , fGeo(nodeindexes) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}